

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::terminatingError(string *message)

{
  ostream *poVar1;
  int __how;
  int __fd;
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
  *in_RDI;
  bool in_stack_0000003f;
  function<void_()> *in_stack_00000040;
  type func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_bool
  *in_stack_ffffffffffffff98;
  undefined1 local_60 [39];
  undefined1 local_39;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_39 = 1;
  std::bind<void(&)(std::__cxx11::string,bool),std::__cxx11::string&,bool>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(bool *)in_RDI);
  std::function<void()>::
  function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
            ((function<void_()> *)in_stack_ffffffffffffff90,in_RDI);
  __how = 0;
  pushContext(in_stack_00000040,in_stack_0000003f);
  __fd = (int)local_60;
  std::function<void_()>::~function((function<void_()> *)0x3e8a1c);
  shutdown(__fd,__how);
  exit(-1);
}

Assistant:

void terminatingError(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  auto func = std::bind(buildErrorUI, message, true);
  pushContext(func, false);

  // Quit the program
  shutdown();
  std::exit(-1);
}